

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpression
QRegularExpression::fromWildcard
          (QStringView pattern,CaseSensitivity cs,WildcardConversionOptions options)

{
  long lVar1;
  uint uVar2;
  int in_ECX;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> in_RDI;
  long in_FS_OFFSET;
  PatternOption reOptions;
  WildcardConversionOptions in_stack_0000018c;
  undefined1 in_stack_00000190 [16];
  PatternOption in_stack_ffffffffffffff6c;
  QFlags<QRegularExpression::PatternOption> *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffff98;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> QVar3;
  QFlagsStorage<QRegularExpression::PatternOption> options_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)(in_ECX != 1);
  QVar3.d.ptr = in_RDI.d.ptr;
  wildcardToRegularExpression((QStringView)in_stack_00000190,in_stack_0000018c);
  options_00.i = (Int)((ulong)QVar3.d.ptr >> 0x20);
  QFlags<QRegularExpression::PatternOption>::QFlags
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  QRegularExpression((QRegularExpression *)CONCAT44(in_ECX,uVar2),in_stack_ffffffffffffff98,
                     (PatternOptions)options_00.i);
  QString::~QString((QString *)0x72fab7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpression QRegularExpression::fromWildcard(QStringView pattern, Qt::CaseSensitivity cs,
                                                    WildcardConversionOptions options)
{
    auto reOptions = cs == Qt::CaseSensitive ? QRegularExpression::NoPatternOption :
                                             QRegularExpression::CaseInsensitiveOption;
    return QRegularExpression(wildcardToRegularExpression(pattern, options), reOptions);
}